

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O2

void __thiscall
pstack::Dwarf::DWARFReader::readForm(DWARFReader *this,Info *info,Unit *unit,Form form)

{
  Exception *this_00;
  Exception local_1e8;
  string local_48;
  
  if ((form != DW_FORM_string) && (form != DW_FORM_line_strp)) {
    if (form == DW_FORM_data16) {
      this->off = this->off + 0x10;
      return;
    }
    if (form != DW_FORM_strp) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1e8,0,0x1a0);
      Exception::Exception(&local_1e8);
      std::operator<<((ostream *)&local_1e8.str,"unhandled form when reading form ");
      std::ostream::operator<<(&local_1e8.str,form);
      Exception::Exception(this_00,&local_1e8);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  readFormString_abi_cxx11_(&local_48,this,info,unit,form);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void
DWARFReader::readForm(const Info &info, Unit &unit, Form form)
{
    switch (form) {
        case DW_FORM_string:
        case DW_FORM_line_strp:
        case DW_FORM_strp:
            readFormString(info, unit, form);
            break;
        case DW_FORM_data16:
            skip(16); // line info uses this for LNCT_MD5
            return;

        default:
            throw (Exception() << "unhandled form when reading form " << form);
    }
}